

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

void __thiscall crnlib::dynamic_string::clear(dynamic_string *this)

{
  dynamic_string *in_RDI;
  
  check(in_RDI);
  if (in_RDI->m_pStr != (char *)0x0) {
    crnlib_delete_array<char>((char *)in_RDI);
    in_RDI->m_pStr = (char *)0x0;
    in_RDI->m_len = 0;
    in_RDI->m_buf_size = 0;
  }
  return;
}

Assistant:

void dynamic_string::clear() {
  check();

  if (m_pStr) {
    crnlib_delete_array(m_pStr);
    m_pStr = NULL;

    m_len = 0;
    m_buf_size = 0;
  }
}